

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O1

vector<Card,_std::allocator<Card>_> * __thiscall
Game::getValidCards(vector<Card,_std::allocator<Card>_> *__return_storage_ptr__,Game *this,
                   size_t playerID,Card *c)

{
  pointer *ppCVar1;
  pointer pvVar2;
  Card *pCVar3;
  iterator __position;
  pointer pCVar4;
  bool bVar5;
  undefined8 uVar6;
  ulong uVar7;
  Card *pCVar8;
  Card card;
  Card local_38;
  
  (__return_storage_ptr__->super__Vector_base<Card,_std::allocator<Card>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Card,_std::allocator<Card>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Card,_std::allocator<Card>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar2 = (this->m_playerCards).
           super__Vector_base<std::vector<Card,_std::allocator<Card>_>,_std::allocator<std::vector<Card,_std::allocator<Card>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar7 = ((long)(this->m_playerCards).
                 super__Vector_base<std::vector<Card,_std::allocator<Card>_>,_std::allocator<std::vector<Card,_std::allocator<Card>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2 >> 3) *
          -0x5555555555555555;
  if (playerID <= uVar7 && uVar7 - playerID != 0) {
    pCVar3 = *(pointer *)
              ((long)&pvVar2[playerID].super__Vector_base<Card,_std::allocator<Card>_>._M_impl.
                      super__Vector_impl_data + 8);
    for (pCVar8 = pvVar2[playerID].super__Vector_base<Card,_std::allocator<Card>_>._M_impl.
                  super__Vector_impl_data._M_start; pCVar8 != pCVar3; pCVar8 = pCVar8 + 1) {
      local_38 = *pCVar8;
      bVar5 = checkValidCard(this,playerID,*c,local_38);
      if (bVar5) {
        __position._M_current =
             (__return_storage_ptr__->super__Vector_base<Card,_std::allocator<Card>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->super__Vector_base<Card,_std::allocator<Card>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<Card,std::allocator<Card>>::_M_realloc_insert<Card_const&>
                    ((vector<Card,std::allocator<Card>> *)__return_storage_ptr__,__position,
                     &local_38);
        }
        else {
          *__position._M_current = local_38;
          ppCVar1 = &(__return_storage_ptr__->super__Vector_base<Card,_std::allocator<Card>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppCVar1 = *ppCVar1 + 1;
        }
      }
    }
    return __return_storage_ptr__;
  }
  uVar6 = std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     playerID);
  pCVar4 = (__return_storage_ptr__->super__Vector_base<Card,_std::allocator<Card>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (pCVar4 != (pointer)0x0) {
    operator_delete(pCVar4);
  }
  _Unwind_Resume(uVar6);
}

Assistant:

std::vector<Card> Game::getValidCards(size_t playerID, Card &c) {
    std::vector<Card> validCards = std::vector<Card>();
    for (Card card : m_playerCards.at(playerID)) {
        if (checkValidCard(playerID, c, card))
            validCards.push_back(card);
    }
    return validCards;
}